

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

void __thiscall AgenPeeps::PeepFunc(AgenPeeps *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Instr *this_00;
  undefined4 *puVar7;
  bool local_69;
  Instr *local_50;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  uint stall_cycles;
  Instr *nextRealInstr;
  Instr *blockStart;
  int distance;
  AgenPeeps *this_local;
  
  blockStart._4_4_ = 0;
  bVar2 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
  if (bVar2) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,AtomPhase,uVar4,uVar5);
    if (bVar2) {
      return;
    }
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,AgenPeepsPhase,uVar4,uVar5);
    if (bVar2) {
      return;
    }
  }
  else {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,AtomPhase,uVar4,uVar5);
    if (!bVar2) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,AgenPeepsPhase,uVar4,uVar5);
      if (!bVar2) {
        return;
      }
    }
  }
  nextRealInstr = (Instr *)0x0;
  local_50 = this->func->m_headInstr;
  do {
    if (local_50 == (Instr *)0x0) {
      return;
    }
    instrStop = local_50->m_next;
    bVar2 = IR::Instr::IsRealInstr(local_50);
    if (bVar2) {
LAB_0087d565:
      bVar2 = IR::Instr::EndsBasicBlock(local_50);
      if ((bVar2) || (bVar2 = IR::Instr::StartsBasicBlock(local_50), bVar2)) {
        blockStart._4_4_ = 0;
        instrStop = IR::Instr::GetNextRealInstr(local_50);
        nextRealInstr = instrStop;
      }
      else {
        this_00 = IR::Instr::GetNextRealInstrOrLabel(local_50);
        bVar2 = IR::Instr::EndsBasicBlock(this_00);
        if (((bVar2) || (bVar2 = IR::Instr::StartsBasicBlock(this_00), bVar2)) ||
           (bVar2 = AgenDependentInstrs(this,local_50,this_00), !bVar2)) {
          blockStart._4_4_ = 0;
        }
        else {
          if (nextRealInstr == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                               ,0x3e,"(blockStart)","blockStart");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          iVar6 = MoveInstrUp(this,local_50,nextRealInstr,blockStart._4_4_);
          blockStart._4_4_ = iVar6 + -3;
        }
      }
    }
    else {
      IVar3 = IR::Instr::GetKind(local_50);
      local_69 = true;
      if (IVar3 != InstrKindLabel) {
        local_69 = IR::Instr::IsProfiledLabelInstr(local_50);
      }
      if (local_69 != false) goto LAB_0087d565;
    }
    local_50 = instrStop;
  } while( true );
}

Assistant:

void AgenPeeps::PeepFunc()
{
    int distance = 0;
    IR::Instr *blockStart, *nextRealInstr;
    const uint stall_cycles = 3;

    if (AutoSystemInfo::Data.IsAtomPlatform())
    {
        // On Atom, always optimize unless phase is off
        if (PHASE_OFF(Js::AtomPhase, func) || PHASE_OFF(Js::AgenPeepsPhase, func))
            return;
    }
    else
    {
        // On other platforms, don't optimize unless phase is forced
        if (!PHASE_FORCE(Js::AtomPhase, func) && !PHASE_FORCE(Js::AgenPeepsPhase, func))
            return;
    }

    blockStart = nullptr;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr() && !instr->IsLabelInstr())
            continue;

        // BB boundary ?
        if (instr->EndsBasicBlock() || instr->StartsBasicBlock())
        {
            distance = 0;
            instrNext = blockStart = instr->GetNextRealInstr();
            continue;
        }
        nextRealInstr = instr->GetNextRealInstrOrLabel();
        // Check for AGEN dependency with the next instruction in the same BB
        if (!nextRealInstr->EndsBasicBlock() && !nextRealInstr->StartsBasicBlock() &&
            AgenDependentInstrs(instr, nextRealInstr))
        {
            Assert(blockStart);
            // Move instr up
            distance = MoveInstrUp(instr, blockStart, distance) - stall_cycles;
        } else
            distance = 0;

    } NEXT_INSTR_IN_FUNC_EDITING;
}